

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void statement(LexState *ls)

{
  uint uVar1;
  l_uint32 *plVar2;
  byte bVar3;
  Dyndata *pDVar4;
  FuncState *pFVar5;
  Instruction *pIVar6;
  int iVar7;
  expkind list;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  BlockCnt *pBVar12;
  TString *pTVar13;
  Labeldesc *pLVar14;
  TString *pTVar15;
  lu_byte lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  char *pcVar20;
  FuncState *pFVar21;
  Dyndata *dyd;
  char **ppcVar22;
  Vardesc *pVVar23;
  FuncState *fs;
  bool bVar24;
  BlockCnt bl1;
  undefined1 local_78 [8];
  undefined1 local_70 [24];
  FuncState *local_58;
  uint local_4c;
  undefined1 local_48 [16];
  byte local_38;
  undefined2 local_37;
  lu_byte local_35;
  
  iVar9 = ls->linenumber;
  luaE_incCstack(ls->L);
  iVar7 = (ls->t).token;
  switch(iVar7) {
  case 0x101:
    pBVar12 = (BlockCnt *)&ls->fs->bl;
    do {
      pBVar12 = pBVar12->previous;
      if (pBVar12 == (BlockCnt *)0x0) {
        pcVar20 = "break outside loop";
        goto LAB_001154a4;
      }
    } while (pBVar12->isloop == '\0');
    pBVar12->isloop = '\x02';
    luaX_next(ls);
    pTVar13 = luaS_newlstr(ls->L,"break",5);
    goto LAB_00114a5e;
  case 0x102:
    luaX_next(ls);
    block(ls);
    check_match(ls,0x105,0x102,iVar9);
    break;
  case 0x103:
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x10b:
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x112:
  case 0x113:
  case 0x114:
    goto switchD_00114861_caseD_103;
  case 0x107:
    pFVar21 = ls->fs;
    local_38 = pFVar21->nactvar;
    pDVar4 = pFVar21->ls->dyd;
    local_48._8_4_ = (pDVar4->label).n;
    local_48._12_4_ = (pDVar4->gt).n;
    local_37._0_1_ = '\0';
    local_37._1_1_ = '\x01';
    local_48._0_8_ = pFVar21->bl;
    if ((BlockCnt *)local_48._0_8_ == (BlockCnt *)0x0) {
      local_35 = false;
    }
    else {
      local_35 = ((BlockCnt *)local_48._0_8_)->insidetbc != '\0';
    }
    pFVar21->bl = (BlockCnt *)local_48;
    luaX_next(ls);
    pTVar13 = str_checkname(ls);
    iVar7 = (ls->t).token;
    if ((iVar7 == 0x2c) || (iVar7 == 0x10b)) {
      pFVar5 = ls->fs;
      local_4c = (uint)pFVar5->freereg;
      local_58 = pFVar21;
      pTVar15 = luaX_newstring(ls,"(for state)",0xb);
      new_localvarkind(ls,pTVar15,'\0');
      pTVar15 = luaX_newstring(ls,"(for state)",0xb);
      new_localvarkind(ls,pTVar15,'\0');
      pTVar15 = luaX_newstring(ls,"(for state)",0xb);
      new_localvarkind(ls,pTVar15,'\0');
      iVar7 = 1;
      new_localvarkind(ls,pTVar13,'\x01');
      if ((ls->t).token == 0x2c) {
        iVar7 = 1;
        do {
          luaX_next(ls);
          pTVar13 = str_checkname(ls);
          new_localvarkind(ls,pTVar13,'\0');
          iVar7 = iVar7 + 1;
        } while ((ls->t).token == 0x2c);
      }
      checknext(ls,0x10b);
      iVar8 = ls->linenumber;
      iVar10 = explist(ls,(expdesc *)local_78);
      adjust_assign((LexState *)ls->fs,4,iVar10,(expdesc *)local_78);
      adjustlocalvars(ls,3);
      pBVar12 = pFVar5->bl;
      pBVar12->upval = '\x01';
      pBVar12->insidetbc = '\x01';
      pFVar5->needclose = '\x01';
      luaK_checkstack(pFVar5,2);
      forbody(ls,local_4c,iVar8,iVar7,1);
      pFVar21 = local_58;
    }
    else {
      if (iVar7 != 0x3d) {
        pcVar20 = "\'=\' or \'in\' expected";
        goto LAB_001154a4;
      }
      pFVar5 = ls->fs;
      local_58 = (FuncState *)CONCAT44(local_58._4_4_,(uint)pFVar5->freereg);
      pTVar15 = luaX_newstring(ls,"(for state)",0xb);
      new_localvarkind(ls,pTVar15,'\0');
      pTVar15 = luaX_newstring(ls,"(for state)",0xb);
      new_localvarkind(ls,pTVar15,'\0');
      new_localvarkind(ls,pTVar13,'\x01');
      checknext(ls,0x3d);
      subexpr(ls,(expdesc *)local_78,0);
      luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      checknext(ls,0x2c);
      subexpr(ls,(expdesc *)local_78,0);
      luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      if ((ls->t).token == 0x2c) {
        luaX_next(ls);
        subexpr(ls,(expdesc *)local_78,0);
        luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      }
      else {
        luaK_int(pFVar5,(uint)pFVar5->freereg,1);
        luaK_reserveregs(pFVar5,1);
      }
      adjustlocalvars(ls,2);
      forbody(ls,(int)local_58,iVar9,1,0);
    }
    check_match(ls,0x105,0x107,iVar9);
    goto LAB_001153f8;
  case 0x108:
    luaX_next(ls);
    singlevar(ls,(expdesc *)local_78);
    while (iVar7 = (ls->t).token, iVar7 == 0x2e) {
      fieldsel(ls,(expdesc *)local_78);
    }
    if (iVar7 == 0x3a) {
      fieldsel(ls,(expdesc *)local_78);
    }
    body(ls,(expdesc *)local_48,(uint)(iVar7 == 0x3a),iVar9);
    check_readonly(ls,(expdesc *)local_78);
    luaK_storevar(ls->fs,(expdesc *)local_78,(expdesc *)local_48);
    luaK_fixline(ls->fs,iVar9);
    break;
  case 0x109:
    luaX_next(ls);
    pTVar13 = str_checkname(ls);
LAB_00114a5e:
    newgotoentry(ls,pTVar13,iVar9);
    break;
  case 0x10a:
    local_58 = ls->fs;
    local_78._0_4_ = 0xffffffff;
    do {
      pFVar21 = ls->fs;
      luaX_next(ls);
      iVar7 = cond(ls);
      checknext(ls,0x112);
      block(ls);
      if ((ls->t).token - 0x103U < 2) {
        iVar8 = luaK_jump(pFVar21);
        luaK_concat(pFVar21,(int *)local_78,iVar8);
      }
      luaK_patchtohere(pFVar21,iVar7);
      iVar7 = (ls->t).token;
    } while (iVar7 == 0x104);
    if (iVar7 == 0x103) {
      luaX_next(ls);
      block(ls);
    }
    check_match(ls,0x105,0x10a,iVar9);
    pFVar21 = local_58;
    list = local_78._0_4_;
    goto LAB_001151f8;
  case 0x10c:
    luaX_next(ls);
    if ((ls->t).token != 0x108) {
      pFVar21 = ls->fs;
      iVar7 = -1;
      iVar9 = 0;
      do {
        pTVar13 = str_checkname(ls);
        if ((ls->t).token == 0x3c) {
          luaX_next(ls);
          pTVar15 = str_checkname(ls);
          ppcVar22 = &pTVar15->contents;
          if (pTVar15->shrlen < '\0') {
            ppcVar22 = (char **)*ppcVar22;
          }
          checknext(ls,0x3e);
          iVar8 = strcmp((char *)ppcVar22,"const");
          if (iVar8 == 0) {
            lVar16 = '\x01';
            goto LAB_00114e06;
          }
          iVar8 = strcmp((char *)ppcVar22,"close");
          if (iVar8 != 0) {
            pcVar20 = luaO_pushfstring(ls->L,"unknown attribute \'%s\'",ppcVar22);
LAB_001154d2:
            luaK_semerror(ls,pcVar20);
          }
          iVar8 = new_localvarkind(ls,pTVar13,'\x02');
          if (iVar7 != -1) {
            luaK_semerror(ls,"multiple to-be-closed variables in local list");
          }
          iVar7 = (uint)pFVar21->nactvar + iVar9;
        }
        else {
          lVar16 = '\0';
LAB_00114e06:
          iVar8 = new_localvarkind(ls,pTVar13,lVar16);
        }
        iVar10 = (ls->t).token;
        if (iVar10 != 0x2c) goto LAB_00114e2e;
        luaX_next(ls);
        iVar9 = iVar9 + 1;
      } while( true );
    }
    luaX_next(ls);
    pFVar21 = ls->fs;
    bVar3 = pFVar21->nactvar;
    pTVar13 = str_checkname(ls);
    new_localvarkind(ls,pTVar13,'\0');
    adjustlocalvars(ls,1);
    body(ls,(expdesc *)local_78,0,ls->linenumber);
    pFVar21->f->locvars
    [*(short *)((long)(pFVar21->ls->dyd->actvar).arr +
               ((long)pFVar21->firstlocal + (ulong)bVar3) * 0x18 + 0xc)].startpc = pFVar21->pc;
    break;
  case 0x110:
    pFVar21 = ls->fs;
    iVar7 = luaK_getlabel(pFVar21);
    local_38 = pFVar21->nactvar;
    pDVar4 = pFVar21->ls->dyd;
    local_70._0_4_ = (pDVar4->label).n;
    local_70._4_4_ = (pDVar4->gt).n;
    local_70[9] = 0;
    local_70[8] = local_38;
    local_70._10_2_ = 1;
    local_78 = (undefined1  [8])pFVar21->bl;
    if (local_78 == (undefined1  [8])0x0) {
      local_35 = false;
    }
    else {
      local_35 = *(lu_byte *)((long)&(((LHS_assign *)local_78)->v).u + 3) != '\0';
    }
    local_70[0xb] = local_35;
    local_37._0_1_ = '\0';
    local_37._1_1_ = '\0';
    pFVar21->bl = (BlockCnt *)local_48;
    local_48._0_8_ = (BlockCnt *)local_78;
    local_48._8_4_ = local_70._0_4_;
    local_48._12_4_ = local_70._4_4_;
    luaX_next(ls);
    statlist(ls);
    check_match(ls,0x114,0x110,iVar9);
    iVar9 = cond(ls);
    leaveblock(pFVar21);
    if ((lu_byte)local_37 != '\0') {
      iVar8 = luaK_jump(pFVar21);
      luaK_patchtohere(pFVar21,iVar9);
      uVar17 = (ulong)local_38;
      do {
        if ((int)uVar17 < 1) {
          uVar11 = 0;
          goto LAB_00115204;
        }
        pVVar23 = (pFVar21->ls->dyd->actvar).arr;
        lVar19 = (long)pFVar21->firstlocal + uVar17;
        uVar17 = uVar17 - 1;
      } while (*(char *)((long)pVVar23 + lVar19 * 0x18 + -0xf) == '\x03');
      uVar11 = (uint)(byte)(*(char *)((long)pVVar23 + lVar19 * 0x18 + -0xe) + 1);
LAB_00115204:
      luaK_codeABCk(pFVar21,OP_CLOSE,uVar11,0,0,0);
      iVar9 = luaK_jump(pFVar21);
      luaK_patchtohere(pFVar21,iVar8);
    }
    luaK_patchlist(pFVar21,iVar9,iVar7);
LAB_001153f8:
    leaveblock(pFVar21);
    break;
  case 0x111:
    luaX_next(ls);
    pFVar21 = ls->fs;
    uVar17 = (ulong)pFVar21->nactvar;
    do {
      if ((int)uVar17 < 1) {
        uVar11 = 0;
        goto LAB_00114ce2;
      }
      pVVar23 = (pFVar21->ls->dyd->actvar).arr;
      lVar19 = (long)pFVar21->firstlocal + uVar17;
      uVar17 = uVar17 - 1;
    } while (*(char *)((long)pVVar23 + lVar19 * 0x18 + -0xf) == '\x03');
    uVar11 = (uint)(byte)(*(char *)((long)pVVar23 + lVar19 * 0x18 + -0xe) + 1);
LAB_00114ce2:
    iVar9 = (ls->t).token;
    uVar1 = iVar9 - 0x103;
    if (((0x1d < uVar1) || (iVar7 = 0, (0x20020007U >> (uVar1 & 0x1f) & 1) == 0)) &&
       (iVar7 = 0, iVar9 != 0x3b)) {
      iVar7 = explist(ls,(expdesc *)local_78);
      if ((local_78._0_4_ & ~VNIL) == VCALL) {
        iVar9 = -1;
        luaK_setreturns(pFVar21,(expdesc *)local_78,-1);
        bVar24 = iVar7 == 1;
        iVar7 = iVar9;
        if ((bVar24 && local_78._0_4_ == VCALL) && (pFVar21->bl->insidetbc == '\0')) {
          pIVar6 = pFVar21->f->code;
          pIVar6[(int)local_70._0_4_] = pIVar6[(int)local_70._0_4_] & 0xffffff80 | 0x45;
        }
      }
      else if (iVar7 == 1) {
        uVar11 = luaK_exp2anyreg(pFVar21,(expdesc *)local_78);
        iVar7 = 1;
      }
      else {
        luaK_exp2nextreg(pFVar21,(expdesc *)local_78);
      }
    }
    luaK_ret(pFVar21,uVar11,iVar7);
    if ((ls->t).token != 0x3b) break;
LAB_00114d19:
    luaX_next(ls);
    break;
  case 0x115:
    pFVar21 = ls->fs;
    luaX_next(ls);
    iVar7 = luaK_getlabel(pFVar21);
    list = cond(ls);
    pDVar4 = pFVar21->ls->dyd;
    local_70._0_4_ = (pDVar4->label).n;
    local_70._4_4_ = (pDVar4->gt).n;
    local_70[9] = 0;
    local_70[8] = pFVar21->nactvar;
    local_70._10_2_ = 1;
    local_78 = (undefined1  [8])pFVar21->bl;
    if (local_78 == (undefined1  [8])0x0) {
      bVar24 = false;
    }
    else {
      bVar24 = *(lu_byte *)((long)&(((LHS_assign *)local_78)->v).u + 3) != '\0';
    }
    local_70[0xb] = bVar24;
    pFVar21->bl = (BlockCnt *)local_78;
    checknext(ls,0x102);
    block(ls);
    iVar8 = luaK_jump(pFVar21);
    luaK_patchlist(pFVar21,iVar8,iVar7);
    check_match(ls,0x105,0x115,iVar9);
    leaveblock(pFVar21);
LAB_001151f8:
    luaK_patchtohere(pFVar21,list);
    break;
  default:
    if (iVar7 == 0x11f) {
      luaX_next(ls);
      pTVar13 = str_checkname(ls);
      checknext(ls,0x11f);
      while ((iVar7 = (ls->t).token, iVar7 == 0x11f || (iVar7 == 0x3b))) {
        statement(ls);
      }
      pFVar21 = ls->fs;
      pDVar4 = ls->dyd;
      iVar8 = pFVar21->firstlabel;
      iVar10 = (pDVar4->label).n;
      if (iVar8 < iVar10) {
        lVar19 = (long)iVar10 - (long)iVar8;
        pLVar14 = (pDVar4->label).arr + iVar8;
        do {
          if (pLVar14->name == pTVar13) {
            ppcVar22 = &pTVar13->contents;
            if (pTVar13->shrlen < '\0') {
              ppcVar22 = (char **)*ppcVar22;
            }
            pcVar20 = luaO_pushfstring(ls->L,"label \'%s\' already defined on line %d",ppcVar22,
                                       (ulong)(uint)pLVar14->line);
            goto LAB_001154d2;
          }
          pLVar14 = pLVar14 + 1;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
      iVar8 = luaK_getlabel(pFVar21);
      iVar9 = newlabelentry(ls,&pDVar4->label,pTVar13,iVar9,iVar8);
      if ((0x1ffffff8U >> ((byte)(iVar7 - 0x103U) & 0x1f) & 1) == 0 && iVar7 - 0x103U < 0x1e) {
        (pDVar4->label).arr[iVar9].nactvar = pFVar21->bl->nactvar;
      }
      break;
    }
    if (iVar7 == 0x3b) goto LAB_00114d19;
    goto switchD_00114861_caseD_103;
  }
LAB_00115400:
  pFVar21 = ls->fs;
  uVar17 = (ulong)pFVar21->nactvar;
  do {
    if ((int)uVar17 < 1) {
      lVar16 = '\0';
      goto LAB_0011543d;
    }
    pVVar23 = (pFVar21->ls->dyd->actvar).arr;
    lVar19 = (long)pFVar21->firstlocal + uVar17;
    uVar17 = uVar17 - 1;
  } while (*(char *)((long)pVVar23 + lVar19 * 0x18 + -0xf) == '\x03');
  lVar16 = *(char *)((long)pVVar23 + lVar19 * 0x18 + -0xe) + '\x01';
LAB_0011543d:
  pFVar21->freereg = lVar16;
  plVar2 = &ls->L->nCcalls;
  *plVar2 = *plVar2 - 1;
  return;
LAB_00114e2e:
  if (iVar10 == 0x3d) {
    luaX_next(ls);
    iVar10 = explist(ls,(expdesc *)local_78);
  }
  else {
    local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffff00000000);
    iVar10 = 0;
  }
  if (((iVar10 + -1 == iVar9) &&
      (pVVar23 = (pFVar21->ls->dyd->actvar).arr + (long)iVar8 + (long)pFVar21->firstlocal,
      (pVVar23->vd).kind == '\x01')) &&
     (iVar8 = luaK_exp2const(pFVar21,(expdesc *)local_78,&pVVar23->k), iVar8 != 0)) {
    (pVVar23->vd).kind = '\x03';
    adjustlocalvars(ls,iVar9);
    pFVar21->nactvar = pFVar21->nactvar + '\x01';
  }
  else {
    adjust_assign((LexState *)ls->fs,iVar9 + 1,iVar10,(expdesc *)local_78);
    adjustlocalvars(ls,iVar9 + 1);
  }
  if (iVar7 != -1) {
    pBVar12 = pFVar21->bl;
    pBVar12->upval = '\x01';
    pBVar12->insidetbc = '\x01';
    pFVar21->needclose = '\x01';
    lVar19 = (long)(iVar7 + -1);
    do {
      if (iVar7 < 1) {
        uVar11 = 0;
        goto LAB_0011545b;
      }
      iVar7 = iVar7 + -1;
      pVVar23 = (pFVar21->ls->dyd->actvar).arr;
      lVar18 = pFVar21->firstlocal + lVar19;
      lVar19 = lVar19 + -1;
    } while (*(char *)((long)pVVar23 + lVar18 * 0x18 + 9) == '\x03');
    uVar11 = (uint)(byte)((&pVVar23->vd)[lVar18].ridx + 1);
LAB_0011545b:
    luaK_codeABCk(pFVar21,OP_TBC,uVar11,0,0,0);
  }
  goto LAB_00115400;
switchD_00114861_caseD_103:
  pFVar21 = ls->fs;
  suffixedexp(ls,(expdesc *)local_70);
  iVar9 = (ls->t).token;
  if ((iVar9 == 0x3d) || (iVar9 == 0x2c)) {
    local_78 = (undefined1  [8])0x0;
    restassign(ls,(LHS_assign *)local_78,1);
  }
  else {
    if (local_70._0_4_ != VCALL) {
      pcVar20 = "syntax error";
LAB_001154a4:
      luaX_syntaxerror(ls,pcVar20);
    }
    *(undefined1 *)((long)pFVar21->f->code + (long)(int)local_70._8_4_ * 4 + 3) = 1;
  }
  goto LAB_00115400;
}

Assistant:

static void statement (LexState *ls) {
  int line = ls->linenumber;  /* may be needed for error messages */
  enterlevel(ls);
  switch (ls->t.token) {
    case ';': {  /* stat -> ';' (empty statement) */
      luaX_next(ls);  /* skip ';' */
      break;
    }
    case TK_IF: {  /* stat -> ifstat */
      ifstat(ls, line);
      break;
    }
    case TK_WHILE: {  /* stat -> whilestat */
      whilestat(ls, line);
      break;
    }
    case TK_DO: {  /* stat -> DO block END */
      luaX_next(ls);  /* skip DO */
      block(ls);
      check_match(ls, TK_END, TK_DO, line);
      break;
    }
    case TK_FOR: {  /* stat -> forstat */
      forstat(ls, line);
      break;
    }
    case TK_REPEAT: {  /* stat -> repeatstat */
      repeatstat(ls, line);
      break;
    }
    case TK_FUNCTION: {  /* stat -> funcstat */
      funcstat(ls, line);
      break;
    }
    case TK_LOCAL: {  /* stat -> localstat */
      luaX_next(ls);  /* skip LOCAL */
      if (testnext(ls, TK_FUNCTION))  /* local function? */
        localfunc(ls);
      else
        localstat(ls);
      break;
    }
    case TK_DBCOLON: {  /* stat -> label */
      luaX_next(ls);  /* skip double colon */
      labelstat(ls, str_checkname(ls), line);
      break;
    }
    case TK_RETURN: {  /* stat -> retstat */
      luaX_next(ls);  /* skip RETURN */
      retstat(ls);
      break;
    }
    case TK_BREAK: {  /* stat -> breakstat */
      breakstat(ls, line);
      break;
    }
    case TK_GOTO: {  /* stat -> 'goto' NAME */
      luaX_next(ls);  /* skip 'goto' */
      gotostat(ls, line);
      break;
    }
    default: {  /* stat -> func | assignment */
      exprstat(ls);
      break;
    }
  }
  lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
             ls->fs->freereg >= luaY_nvarstack(ls->fs));
  ls->fs->freereg = luaY_nvarstack(ls->fs);  /* free registers */
  leavelevel(ls);
}